

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O3

void __thiscall
dense_parameters::set_default<polar_normal_weights_wrapper<dense_parameters>>
          (dense_parameters *this)

{
  weight *pwVar1;
  uint32_t uVar2;
  long lVar3;
  
  pwVar1 = this->_begin;
  if (pwVar1 != pwVar1 + this->_weight_mask + 1) {
    uVar2 = this->_stride_shift;
    lVar3 = 0;
    do {
      polar_normal_weights_wrapper<dense_parameters>::func
                ((weight *)((long)pwVar1 + lVar3),lVar3 >> 2);
      lVar3 = lVar3 + (1L << ((byte)uVar2 & 0x3f)) * 4;
    } while ((weight *)((long)pwVar1 + lVar3) != this->_begin + this->_weight_mask + 1);
  }
  return;
}

Assistant:

iterator end() { return iterator(_begin + _weight_mask + 1, _begin, stride()); }